

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-test.c++
# Opt level: O0

void __thiscall kj::anon_unknown_0::TestCase957::run(TestCase957 *this)

{
  SourceLocation location;
  bool bVar1;
  uint local_200;
  bool local_1f9;
  uint local_1f8;
  DebugExpression<unsigned_int> DStack_1f4;
  bool _kj_shouldLog_1;
  undefined1 local_1f0 [8];
  DebugComparison<unsigned_int,_unsigned_int_&> _kjCondition_1;
  int local_1c0;
  DebugExpression<int> DStack_1bc;
  bool _kj_shouldLog;
  undefined1 local_1b8 [8];
  DebugComparison<int,_int_&> _kjCondition;
  SourceLocation local_188;
  Type local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [8];
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_test_c__:976:37),_void>
  ignore;
  Type local_140;
  undefined1 local_138 [24];
  undefined1 local_120 [8];
  int counter;
  EventLoop *pEStack_110;
  coroutine_handle<void> local_108;
  undefined1 local_100 [8];
  TaskSet tasks;
  ErrorHandlerImpl errorHandler;
  undefined1 local_a8 [8];
  WaitScope waitScope;
  EventLoop loop;
  TestCase957 *this_local;
  
  EventLoop::EventLoop((EventLoop *)&waitScope.runningStacksPool);
  WaitScope::WaitScope((WaitScope *)local_a8,(EventLoop *)&waitScope.runningStacksPool);
  ErrorHandlerImpl::ErrorHandlerImpl((ErrorHandlerImpl *)&tasks.location.lineNumber);
  SourceLocation::SourceLocation
            ((SourceLocation *)&counter,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x3c1,0xb);
  location.function = (char *)pEStack_110;
  location.fileName = (char *)_counter;
  location._16_8_ = local_108._M_fr_ptr;
  TaskSet::TaskSet((TaskSet *)local_100,(ErrorHandler *)&tasks.location.lineNumber,location);
  local_120._0_4_ = 0;
  local_138._8_8_ = local_120;
  evalLater<kj::(anonymous_namespace)::TestCase957::run()::__0>
            ((kj *)(local_138 + 0x10),(Type *)(local_138 + 8));
  TaskSet::add((TaskSet *)local_100,(Promise<void> *)(local_138 + 0x10));
  Promise<void>::~Promise((Promise<void> *)(local_138 + 0x10));
  local_140.counter = (int *)local_120;
  evalLater<kj::(anonymous_namespace)::TestCase957::run()::__1>((kj *)local_138,&local_140);
  TaskSet::add((TaskSet *)local_100,(Promise<void> *)local_138);
  Promise<void>::~Promise((Promise<void> *)local_138);
  ignore.super_PromiseBase.node.ptr = (PromiseBase)local_120;
  evalLater<kj::(anonymous_namespace)::TestCase957::run()::__2>
            ((kj *)&stack0xfffffffffffffeb8,(Type *)&ignore);
  TaskSet::add((TaskSet *)local_100,(Promise<void> *)&stack0xfffffffffffffeb8);
  Promise<void>::~Promise((Promise<void> *)&stack0xfffffffffffffeb8);
  evalLater<kj::(anonymous_namespace)::TestCase957::run()::__3>
            ((kj *)local_158,(Type *)(local_168 + 0xf));
  local_170.counter = (int *)local_120;
  evalLater<kj::(anonymous_namespace)::TestCase957::run()::__4>((kj *)local_168,&local_170);
  SourceLocation::SourceLocation
            (&local_188,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
             ,"run",0x3d4,3);
  Promise<void>::wait((Promise<void> *)local_168,local_a8);
  Promise<void>::~Promise((Promise<void> *)local_168);
  local_1c0 = 4;
  DStack_1bc = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1c0);
  kj::_::DebugExpression<int>::operator==
            ((DebugComparison<int,_int_&> *)local_1b8,&stack0xfffffffffffffe44,(int *)local_120);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1b8);
  if (!bVar1) {
    _kjCondition_1._39_1_ = kj::_::Debug::shouldLog(ERROR);
    while (_kjCondition_1._39_1_ != '\0') {
      _kjCondition_1.result = true;
      _kjCondition_1._33_3_ = 0;
      kj::_::Debug::log<char_const(&)[34],kj::_::DebugComparison<int,int&>&,int,int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3d8,ERROR,"\"failed: expected \" \"(4) == (counter)\", _kjCondition, 4, counter"
                 ,(char (*) [34])"failed: expected (4) == (counter)",
                 (DebugComparison<int,_int_&> *)local_1b8,(int *)&_kjCondition_1.result,
                 (int *)local_120);
      _kjCondition_1._39_1_ = 0;
    }
  }
  local_1f8 = 1;
  DStack_1f4 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_1f8);
  kj::_::DebugExpression<unsigned_int>::operator==
            ((DebugComparison<unsigned_int,_unsigned_int_&> *)local_1f0,&stack0xfffffffffffffe0c,
             (uint *)&errorHandler);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_1f0);
  if (!bVar1) {
    local_1f9 = kj::_::Debug::shouldLog(ERROR);
    while (local_1f9 != false) {
      local_200 = 1;
      kj::_::Debug::
      log<char_const(&)[55],kj::_::DebugComparison<unsigned_int,unsigned_int&>&,unsigned_int,unsigned_int&>
                ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-test.c++"
                 ,0x3d9,ERROR,
                 "\"failed: expected \" \"(1u) == (errorHandler.exceptionCount)\", _kjCondition, 1u, errorHandler.exceptionCount"
                 ,(char (*) [55])"failed: expected (1u) == (errorHandler.exceptionCount)",
                 (DebugComparison<unsigned_int,_unsigned_int_&> *)local_1f0,&local_200,
                 (uint *)&errorHandler);
      local_1f9 = false;
    }
  }
  Promise<void>::~Promise((Promise<void> *)local_158);
  TaskSet::~TaskSet((TaskSet *)local_100);
  WaitScope::~WaitScope((WaitScope *)local_a8);
  EventLoop::~EventLoop((EventLoop *)&waitScope.runningStacksPool);
  return;
}

Assistant:

TEST(Async, TaskSet) {
  EventLoop loop;
  WaitScope waitScope(loop);
  ErrorHandlerImpl errorHandler;
  TaskSet tasks(errorHandler);

  int counter = 0;

  tasks.add(evalLater([&]() {
    EXPECT_EQ(0, counter++);
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(1, counter++);
    KJ_FAIL_ASSERT("example TaskSet failure") { break; }
  }));
  tasks.add(evalLater([&]() {
    EXPECT_EQ(2, counter++);
  }));

  auto ignore KJ_UNUSED = evalLater([&]() {
    KJ_FAIL_EXPECT("Promise without waiter shouldn't execute.");
  });

  evalLater([&]() {
    EXPECT_EQ(3, counter++);
  }).wait(waitScope);

  EXPECT_EQ(4, counter);
  EXPECT_EQ(1u, errorHandler.exceptionCount);
}